

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O2

void __thiscall KeyData_FromStringPubkey_Test::TestBody(KeyData_FromStringPubkey_Test *this)

{
  bool bVar1;
  size_t idx;
  ulong uVar2;
  char *pcVar3;
  char *in_R9;
  long lVar4;
  initializer_list<unsigned_int> __l;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_;
  AssertHelper local_328;
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> obj_arr;
  AssertionResult gtest_ar;
  string key1;
  KeyData obj1;
  
  std::__cxx11::string::string
            ((string *)&key1,
             "[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
             (allocator *)&obj1);
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x100000000;
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&obj1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&array1,__l,(allocator_type *)&gtest_ar);
  cfd::core::KeyData::KeyData(&obj1);
  cfd::core::KeyData::KeyData((KeyData *)&gtest_ar,&key1,-1,false);
  cfd::core::KeyData::operator=(&obj1,(KeyData *)&gtest_ar);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar);
  cfd::core::KeyData::GetChildNumArray(&obj_arr,&obj1);
  bVar1 = cfd::core::KeyData::IsValid(&obj1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x45f8a3,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x201,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::KeyData::HasPrivkey(&obj1);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"obj.HasPrivkey()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x202,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::KeyData::HasExtPubkey(&obj1);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"obj.HasExtPubkey()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x203,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::KeyData::HasExtPrivkey(&obj1);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"obj.HasExtPrivkey()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x204,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ =
       (long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  gtest_ar_2._0_8_ =
       (long)obj_arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)obj_arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"arr_obj.size()","obj_arr.size()",(unsigned_long *)&gtest_ar_,
             (unsigned_long *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x205,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)&gtest_ar,&obj1,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"\"0/1/2\"","obj.GetBip32Path().c_str()","0/1/2",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x206,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::GetFingerprint((ByteData *)&gtest_ar_,&obj1);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&gtest_ar_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"\"12345678\"","obj.GetFingerprint().GetHex().c_str()",
             "12345678",(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x207,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::KeyData::GetPubkey((Pubkey *)&gtest_ar_,&obj1);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&gtest_ar,(Pubkey *)&gtest_ar_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "\"021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647\"",
             "obj.GetPubkey().GetHex().c_str()",
             "021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x20a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  lVar4 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"arr_obj[idx]","obj_arr[idx]",
               (uint *)((long)array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar4),
               (uint *)((long)obj_arr.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar4));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
                 ,0x20c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar4 = lVar4 + 4;
  }
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&gtest_ar,&obj1,true,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,
             "\"[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647\""
             ,"obj.ToString().c_str()",
             "[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x210,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)&gtest_ar,&obj1,kApostrophe,true);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"\"0x0/0x1/0x2\"",
             "obj.GetBip32Path(HardenedType::kApostrophe, true).c_str()","0x0/0x1/0x2",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x212,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&obj_arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::KeyData::~KeyData(&obj1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&key1);
  return;
}

Assistant:

TEST(KeyData, FromStringPubkey) {
  std::string key1 = "[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647";
  std::vector<uint32_t> array1{0, 1, 2};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_FALSE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("0/1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("12345678", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.ToString().c_str());
    EXPECT_STREQ("0x0/0x1/0x2",
        obj.GetBip32Path(HardenedType::kApostrophe, true).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }
}